

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

void __thiscall bitfoot::Bitfoot::AddEpCaps<true>(Bitfoot *this)

{
  uint to;
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint from;
  ulong uVar7;
  
  if ((long)this->ep == 0x40) {
    __assert_fail("ep != NoSquare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xb36,"void bitfoot::Bitfoot::AddEpCaps() [color = true]");
  }
  uVar7 = this->pc[3] & *(ulong *)(_PAWN_ATK + (long)this->ep * 8);
  do {
    if (uVar7 == 0) {
      return;
    }
    to = this->ep;
    uVar5 = (ulong)to;
    if (0x3f < uVar5) {
      __assert_fail("IS_SQUARE(to)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x2de,
                    "bool bitfoot::Bitfoot::Pinned(const int, const int) const [color = true]");
    }
    lVar1 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    from = (uint)lVar1;
    if (to == from) {
      __assert_fail("from != to",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0x2df,
                    "bool bitfoot::Bitfoot::Pinned(const int, const int) const [color = true]");
    }
    if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[1]) == 0) {
LAB_0011ab52:
      bVar3 = EpPinned<true>(this,from,to);
      if (!bVar3) {
        AddMove<true,(bitfoot::MoveType)5>(this,3,from,this->ep,100,2,0);
      }
    }
    else if ((*(ulong *)(_BITMAP + uVar5 * 8) & this->pinned[1]) != 0) {
      iVar4 = 0;
      if ((ulong)(uint)this->king[1] < 0x40) {
        iVar4 = *(int *)((ulong)(from << 8) + 0x1b2660 + (ulong)(uint)this->king[1] * 4);
      }
      iVar2 = -iVar4;
      if (0 < iVar4) {
        iVar2 = iVar4;
      }
      iVar4 = *(int *)((ulong)(from << 8) + 0x1b2660 + uVar5 * 4);
      iVar6 = -iVar4;
      if (0 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar2 == iVar6) goto LAB_0011ab52;
    }
    uVar7 = uVar7 & uVar7 - 1;
  } while( true );
}

Assistant:

inline void AddEpCaps() {
    assert(ep != NoSquare);
    int from;
    uint64_t pawns = (_PAWN_ATK[!color][ep] & pc[color|Pawn]);
    while (pawns) {
      PopLowSquare(pawns, from);
      if (!Pinned<color>(from, ep) && !EpPinned<color>(from, ep)) {
        AddMove<color, EnPassant>((color|Pawn), from, ep,
                                  PawnValue, ((!color)|Pawn), 0);
      }
    }
  }